

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.cpp
# Opt level: O0

void Shell::Shuffling::shuffle(Clause *clause)

{
  uint uVar1;
  Literal **ppLVar2;
  ulong uVar3;
  Clause *in_RDI;
  uint s;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = Kernel::Clause::numSelected(in_RDI);
  Kernel::Clause::literals(in_RDI);
  shuffleArray<Kernel::Literal*>
            ((Literal **)CONCAT44(uVar1,in_stack_fffffffffffffff0),
             (uint)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  ppLVar2 = Kernel::Clause::literals(in_RDI);
  uVar3 = (ulong)uVar1;
  Kernel::Clause::length(in_RDI);
  shuffleArray<Kernel::Literal*>
            ((Literal **)CONCAT44(uVar1,in_stack_fffffffffffffff0),
             (uint)((ulong)(ppLVar2 + uVar3) >> 0x20));
  Kernel::Clause::notifyLiteralReorder((Clause *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void Shuffling::shuffle(Clause* clause)
{
  unsigned s = clause->numSelected();

  // don't shuffle between selected and non-selected literals
  shuffleArray(clause->literals(),s);
  shuffleArray(clause->literals()+s,clause->length()-s);

  // literals must be shared in typical clauses (I think), so let's not even try shuffling them

  clause->notifyLiteralReorder();
}